

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eimgfs.cpp
# Opt level: O0

void __thiscall
XipFile::FileEntry::fromstream(FileEntry *this,XipFile *xip,allocmap *m,ReadWriter_ptr *r)

{
  int iVar1;
  uint32_t uVar2;
  element_type *peVar3;
  undefined4 extraout_var;
  reference pvVar4;
  size_type sVar5;
  reference compdata;
  size_t sVar6;
  undefined8 uVar7;
  undefined8 *puVar8;
  undefined1 local_b0 [16];
  string local_a0;
  _Base_ptr local_80;
  uint8_t *pdata;
  undefined1 local_70 [8];
  ByteVector compressed;
  allocator<unsigned_char> local_41;
  undefined1 local_40 [8];
  ByteVector filedata;
  ReadWriter_ptr *r_local;
  allocmap *m_local;
  XipFile *xip_local;
  FileEntry *this_local;
  
  filedata.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)r;
  peVar3 = std::__shared_ptr_access<ReadWriter,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<ReadWriter,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)r
                     );
  iVar1 = (*peVar3->_vptr_ReadWriter[6])();
  std::allocator<unsigned_char>::allocator(&local_41);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40,
             CONCAT44(extraout_var,iVar1),&local_41);
  std::allocator<unsigned_char>::~allocator(&local_41);
  peVar3 = std::__shared_ptr_access<ReadWriter,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<ReadWriter,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)r
                     );
  pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40,0);
  sVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40);
  (*peVar3->_vptr_ReadWriter[2])(peVar3,pvVar4,sVar5);
  sVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40);
  std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)((long)&pdata + 7));
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_70,sVar5,
             (allocator<unsigned_char> *)((long)&pdata + 7));
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)((long)&pdata + 7));
  sVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40);
  (this->super_XipEntry)._size = (uint32_t)sVar5;
  pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40,0);
  sVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40);
  compdata = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_70,0);
  sVar6 = compress(pvVar4,sVar5,compdata);
  this->_compsize = (uint32_t)sVar6;
  local_80 = (_Base_ptr)
             std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_70,0);
  if ((this->_compsize < (this->super_XipEntry)._size) && (this->_compsize != 0)) {
    (this->super_XipEntry)._attr = (this->super_XipEntry)._attr | 0x800;
  }
  else {
    this->_compsize = (this->super_XipEntry)._size;
    local_80 = (_Base_ptr)
               std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40,0);
  }
  uVar2 = roundsize(this->_compsize,4);
  uVar2 = allocmap::findfree(m,uVar2);
  this->_rvaload = uVar2;
  if (this->_rvaload == 0) {
    XipEntry::name_abi_cxx11_((string *)(local_b0 + 0x10),&this->super_XipEntry,xip);
    uVar7 = std::__cxx11::string::c_str();
    printf("error writing xip:%s - tried to alloc 0x%x bytes\n",uVar7,(ulong)this->_compsize);
    std::__cxx11::string::~string((string *)(local_b0 + 0x10));
    puVar8 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar8 = "xip: could not alloc space for filedata";
    __cxa_throw(puVar8,&char_const*::typeinfo,0);
  }
  getrvareader((XipFile *)local_b0,(uint32_t)xip,this->_rvaload);
  peVar3 = std::__shared_ptr_access<ReadWriter,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<ReadWriter,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      local_b0);
  (*peVar3->_vptr_ReadWriter[3])(peVar3,local_80,(ulong)this->_compsize);
  std::shared_ptr<ReadWriter>::~shared_ptr((shared_ptr<ReadWriter> *)local_b0);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_70);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40);
  return;
}

Assistant:

virtual void fromstream(XipFile& xip, allocmap& m, ReadWriter_ptr r)
        {
            ByteVector filedata(r->size());
            r->read(&filedata[0], filedata.size());
            ByteVector compressed(filedata.size());
            _size= filedata.size();
            _compsize= XipFile::compress(&filedata[0], filedata.size(), &compressed[0]);
            const uint8_t *pdata= &compressed[0];
            if (_compsize>=_size || _compsize==0) {
                _compsize= _size;
                pdata= &filedata[0];
            }
            else {
                _attr |= 0x800;   // compressed
            }
            _rvaload= m.findfree(roundsize(_compsize, 4));
            if (_rvaload==0) {
                printf("error writing xip:%s - tried to alloc 0x%x bytes\n", name(xip).c_str(), _compsize);
                throw "xip: could not alloc space for filedata";
            }
            xip.getrvareader(_rvaload, _compsize)->write(pdata, _compsize);
        }